

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseSignalSuffix(Ver_Man_t *pMan,char *pWord,int *pnMsb,int *pnLsb)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcStack_38;
  int Length;
  char *pCur;
  int *pnLsb_local;
  int *pnMsb_local;
  char *pWord_local;
  Ver_Man_t *pMan_local;
  
  sVar3 = strlen(pWord);
  iVar1 = (int)sVar3;
  if (pWord[iVar1 + -1] != ']') {
    __assert_fail("pWord[Length-1] == \']\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                  ,0x2c0,"int Ver_ParseSignalSuffix(Ver_Man_t *, char *, int *, int *)");
  }
  for (pcStack_38 = pWord + (long)iVar1 + -2;
      ((pcStack_38 != pWord && (*pcStack_38 != ':')) && (*pcStack_38 != '['));
      pcStack_38 = pcStack_38 + -1) {
  }
  if (pcStack_38 == pWord) {
    sprintf(pMan->sError,"Cannot find opening bracket in signal name %s.",pWord);
    Ver_ParsePrintErrorMessage(pMan);
    pMan_local._4_4_ = 0;
  }
  else if (*pcStack_38 == '[') {
    iVar1 = atoi(pcStack_38 + 1);
    *pnLsb = iVar1;
    *pnMsb = iVar1;
    *pcStack_38 = '\0';
    pMan_local._4_4_ = 1;
  }
  else {
    if (*pcStack_38 != ':') {
      __assert_fail("*pCur == \':\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                    ,0x2d1,"int Ver_ParseSignalSuffix(Ver_Man_t *, char *, int *, int *)");
    }
    iVar2 = atoi(pcStack_38 + 1);
    *pnLsb = iVar2;
    for (pcStack_38 = pWord + (long)iVar1 + -2; (pcStack_38 != pWord && (*pcStack_38 != '['));
        pcStack_38 = pcStack_38 + -1) {
    }
    if (pcStack_38 == pWord) {
      sprintf(pMan->sError,"Cannot find opening bracket in signal name %s.",pWord);
      Ver_ParsePrintErrorMessage(pMan);
      pMan_local._4_4_ = 0;
    }
    else {
      if (*pcStack_38 != '[') {
        __assert_fail("*pCur == \'[\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x2de,"int Ver_ParseSignalSuffix(Ver_Man_t *, char *, int *, int *)");
      }
      iVar1 = atoi(pcStack_38 + 1);
      *pnMsb = iVar1;
      *pcStack_38 = '\0';
      pMan_local._4_4_ = 1;
    }
  }
  return pMan_local._4_4_;
}

Assistant:

int Ver_ParseSignalSuffix( Ver_Man_t * pMan, char * pWord, int * pnMsb, int * pnLsb )
{
    char * pCur;
    int Length;
    Length = strlen(pWord);
    assert( pWord[Length-1] == ']' );
    // walk backward
    for ( pCur = pWord + Length - 2; pCur != pWord; pCur-- )
        if ( *pCur == ':' || *pCur == '[' )
            break;
    if ( pCur == pWord )
    {
        sprintf( pMan->sError, "Cannot find opening bracket in signal name %s.", pWord );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    if ( *pCur == '[' )
    {
        *pnMsb = *pnLsb = atoi(pCur+1);
        *pCur = 0;
        return 1;
    }
    assert( *pCur == ':' );
    // get the end of the interval
    *pnLsb = atoi(pCur+1);
    // find the beginning
    for ( pCur = pWord + Length - 2; pCur != pWord; pCur-- )
        if ( *pCur == '[' )
            break;
    if ( pCur == pWord )
    {
        sprintf( pMan->sError, "Cannot find opening bracket in signal name %s.", pWord );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    assert( *pCur == '[' );
    // get the beginning of the interval
    *pnMsb = atoi(pCur+1);
    // cut the word
    *pCur = 0;
    return 1;
}